

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fbank.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  byte use_power;
  undefined1 uVar3;
  ostream *poVar4;
  int *actual_read_size;
  long in_RSI;
  int in_EDI;
  ostringstream error_message_20;
  ostringstream error_message_19;
  ostringstream error_message_18;
  ostringstream error_message_17;
  ostringstream error_message_16;
  double energy;
  vector<double,_std::allocator<double>_> output;
  vector<double,_std::allocator<double>_> processed_input;
  vector<double,_std::allocator<double>_> input;
  int output_length;
  int input_length;
  ostringstream error_message_15;
  MelFilterBankAnalysis analysis;
  ostringstream error_message_14;
  Buffer buffer_for_spectral_analysis;
  WaveformToSpectrum waveform_to_spectrum;
  ostringstream error_message_13;
  SpectrumToSpectrum spectrum_to_spectrum;
  istream *input_stream;
  ostringstream error_message_12;
  ifstream ifs;
  ostringstream error_message_11;
  char *input_file;
  ostringstream error_message_10;
  int num_input_files;
  ostringstream error_message_9;
  ostringstream error_message_8;
  double sampling_rate_in_hz;
  ostringstream error_message_7;
  ostringstream error_message_6;
  int tmp_1;
  int max_1;
  int min_1;
  ostringstream error_message_5;
  int tmp;
  int max;
  int min;
  ostringstream error_message_4;
  ostringstream error_message_3;
  ostringstream error_message_2;
  ostringstream error_message_1;
  ostringstream error_message;
  int option_char;
  double floor;
  OutputFormats output_format;
  InputFormats input_format;
  bool is_highest_frequency_specified;
  double highest_frequency;
  double lowest_frequency;
  double sampling_rate;
  int fft_length;
  int num_channel;
  option *in_stack_ffffffffffffd458;
  Buffer *buffer;
  WaveformToSpectrum *in_stack_ffffffffffffd460;
  string *in_stack_ffffffffffffd468;
  allocator *paVar5;
  undefined4 in_stack_ffffffffffffd470;
  int in_stack_ffffffffffffd474;
  size_type in_stack_ffffffffffffd478;
  undefined7 in_stack_ffffffffffffd480;
  undefined1 in_stack_ffffffffffffd487;
  undefined7 in_stack_ffffffffffffd490;
  undefined1 in_stack_ffffffffffffd497;
  ostream *in_stack_ffffffffffffd498;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffd4a0;
  int in_stack_ffffffffffffd4a8;
  int in_stack_ffffffffffffd4ac;
  WaveformToSpectrum *in_stack_ffffffffffffd4b0;
  undefined4 in_stack_ffffffffffffd4f0;
  int iVar6;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffd4f8;
  undefined7 in_stack_ffffffffffffd500;
  undefined1 in_stack_ffffffffffffd507;
  MelFilterBankAnalysis *in_stack_ffffffffffffd508;
  InputOutputFormats in_stack_ffffffffffffd514;
  undefined8 in_stack_ffffffffffffd518;
  undefined7 in_stack_ffffffffffffd520;
  undefined1 in_stack_ffffffffffffd527;
  char *local_2ad8;
  double in_stack_ffffffffffffd538;
  double in_stack_ffffffffffffd540;
  undefined7 in_stack_ffffffffffffd548;
  byte in_stack_ffffffffffffd54f;
  char *in_stack_ffffffffffffd550;
  int in_stack_ffffffffffffd558;
  _Ios_Openmode in_stack_ffffffffffffd55c;
  MelFilterBankAnalysis *in_stack_ffffffffffffd560;
  char *local_2a90;
  bool local_2a42;
  byte local_29fa;
  undefined4 in_stack_ffffffffffffd648;
  byte in_stack_ffffffffffffd64c;
  undefined1 in_stack_ffffffffffffd64d;
  byte in_stack_ffffffffffffd64e;
  undefined1 in_stack_ffffffffffffd64f;
  string *in_stack_ffffffffffffd650;
  bool local_298a;
  bool local_295a;
  bool local_2932;
  bool local_28e2;
  allocator local_28c1;
  string local_28c0 [32];
  ostringstream local_28a0 [383];
  allocator local_2721;
  string local_2720 [32];
  ostringstream local_2700 [383];
  allocator local_2581;
  string local_2580 [32];
  ostringstream local_2560 [383];
  allocator local_23e1;
  string local_23e0 [32];
  ostringstream local_23c0 [383];
  allocator local_2241;
  string local_2240 [32];
  ostringstream local_2220 [376];
  ostream local_20a8 [108];
  int local_203c;
  int local_2038;
  allocator local_2031;
  string local_2030 [32];
  ostringstream local_2010 [376];
  MelFilterBankAnalysis local_1e98;
  allocator local_1e21;
  string local_1e20 [32];
  ostringstream local_1e00 [815];
  allocator local_1ad1;
  string local_1ad0 [32];
  ostringstream local_1ab0 [376];
  SpectrumToSpectrum local_1938;
  char *local_18f0;
  undefined4 local_18e8;
  allocator local_18e1;
  string local_18e0 [32];
  ostringstream local_18c0 [376];
  char local_1748 [527];
  allocator local_1539;
  string local_1538 [32];
  ostringstream local_1518 [376];
  char *local_13a0;
  allocator local_1391;
  string local_1390 [32];
  ostringstream local_1370 [376];
  int local_11f8;
  allocator local_11f1;
  string local_11f0 [32];
  ostringstream local_11d0 [383];
  allocator local_1051;
  string local_1050 [32];
  ostringstream local_1030 [376];
  double local_eb8;
  allocator local_ea9;
  string local_ea8 [32];
  ostringstream local_e88 [383];
  allocator local_d09;
  string local_d08 [39];
  allocator local_ce1;
  string local_ce0 [32];
  ostringstream local_cc0 [383];
  allocator local_b41;
  string local_b40 [32];
  int local_b20;
  undefined4 local_b1c;
  undefined4 local_b18;
  allocator local_b11;
  string local_b10 [32];
  ostringstream local_af0 [383];
  allocator local_971;
  string local_970 [32];
  int local_950;
  undefined4 local_94c;
  undefined4 local_948;
  allocator local_941;
  string local_940 [32];
  ostringstream local_920 [383];
  allocator local_7a1;
  string local_7a0 [39];
  allocator local_779;
  string local_778 [32];
  ostringstream local_758 [383];
  allocator local_5d9;
  string local_5d8 [39];
  allocator local_5b1;
  string local_5b0 [32];
  ostringstream local_590 [383];
  allocator local_411;
  string local_410 [39];
  allocator local_3e9;
  string local_3e8 [32];
  ostringstream local_3c8 [383];
  allocator local_249;
  string local_248 [39];
  allocator local_221;
  string local_220 [32];
  ostringstream local_200 [399];
  allocator local_71;
  string local_70 [36];
  int local_4c;
  double local_48;
  int local_3c;
  int local_38;
  byte local_31;
  double local_30;
  double local_28;
  double local_20;
  int local_18;
  int local_14;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_14 = 0x14;
  local_18 = 0x100;
  local_20 = 16.0;
  local_28 = 0.0;
  local_30 = 0.0;
  local_31 = 0;
  local_38 = 4;
  local_3c = 0;
  local_48 = 1.0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  while (local_4c = ya_getopt_long(in_stack_ffffffffffffd474,(char **)in_stack_ffffffffffffd468,
                                   (char *)in_stack_ffffffffffffd460,in_stack_ffffffffffffd458,
                                   (int *)0x1048d2), pcVar1 = ya_optarg, local_4c != -1) {
    switch(local_4c) {
    case 0x48:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_7a0,pcVar1,&local_7a1);
      bVar2 = sptk::ConvertStringToDouble
                        (in_stack_ffffffffffffd468,(double *)in_stack_ffffffffffffd460);
      local_298a = !bVar2 || local_30 <= 0.0;
      std::__cxx11::string::~string(local_7a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_7a1);
      if (local_298a) {
        std::__cxx11::ostringstream::ostringstream(local_920);
        std::operator<<((ostream *)local_920,
                        "The argument for the -H option must be a positive number");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_940,"fbank",&local_941);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffd650,
                   (ostringstream *)
                   CONCAT17(in_stack_ffffffffffffd64f,
                            CONCAT16(in_stack_ffffffffffffd64e,
                                     CONCAT15(in_stack_ffffffffffffd64d,
                                              CONCAT14(in_stack_ffffffffffffd64c,
                                                       in_stack_ffffffffffffd648)))));
        std::__cxx11::string::~string(local_940);
        std::allocator<char>::~allocator((allocator<char> *)&local_941);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_920);
        return local_4;
      }
      local_31 = 1;
      break;
    default:
      anon_unknown.dwarf_18df::PrintUsage((ostream *)in_stack_ffffffffffffd4b0);
      return 1;
    case 0x4c:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5d8,pcVar1,&local_5d9);
      bVar2 = sptk::ConvertStringToDouble
                        (in_stack_ffffffffffffd468,(double *)in_stack_ffffffffffffd460);
      local_295a = !bVar2 || local_28 < 0.0;
      std::__cxx11::string::~string(local_5d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_5d9);
      if (local_295a) {
        std::__cxx11::ostringstream::ostringstream(local_758);
        poVar4 = std::operator<<((ostream *)local_758,"The argument for the -L option must be a ");
        std::operator<<(poVar4,"non-negative number");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_778,"fbank",&local_779);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffd650,
                   (ostringstream *)
                   CONCAT17(in_stack_ffffffffffffd64f,
                            CONCAT16(in_stack_ffffffffffffd64e,
                                     CONCAT15(in_stack_ffffffffffffd64d,
                                              CONCAT14(in_stack_ffffffffffffd64c,
                                                       in_stack_ffffffffffffd648)))));
        std::__cxx11::string::~string(local_778);
        std::allocator<char>::~allocator((allocator<char> *)&local_779);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_758);
        return local_4;
      }
      break;
    case 0x65:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d08,pcVar1,&local_d09);
      bVar2 = sptk::ConvertStringToDouble
                        (in_stack_ffffffffffffd468,(double *)in_stack_ffffffffffffd460);
      local_2a42 = !bVar2 || local_48 <= 0.0;
      std::__cxx11::string::~string(local_d08);
      std::allocator<char>::~allocator((allocator<char> *)&local_d09);
      if (local_2a42) {
        std::__cxx11::ostringstream::ostringstream(local_e88);
        std::operator<<((ostream *)local_e88,
                        "The argument for the -e option must be a positive number");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_ea8,"fbank",&local_ea9);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffd650,
                   (ostringstream *)
                   CONCAT17(in_stack_ffffffffffffd64f,
                            CONCAT16(in_stack_ffffffffffffd64e,
                                     CONCAT15(in_stack_ffffffffffffd64d,
                                              CONCAT14(in_stack_ffffffffffffd64c,
                                                       in_stack_ffffffffffffd648)))));
        std::__cxx11::string::~string(local_ea8);
        std::allocator<char>::~allocator((allocator<char> *)&local_ea9);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_e88);
        return local_4;
      }
      break;
    case 0x68:
      anon_unknown.dwarf_18df::PrintUsage((ostream *)in_stack_ffffffffffffd4b0);
      return 0;
    case 0x6c:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_248,pcVar1,&local_249);
      bVar2 = sptk::ConvertStringToInteger
                        (in_stack_ffffffffffffd468,(int *)in_stack_ffffffffffffd460);
      std::__cxx11::string::~string(local_248);
      std::allocator<char>::~allocator((allocator<char> *)&local_249);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_3c8);
        std::operator<<((ostream *)local_3c8,"The argument for the -l option must be an integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3e8,"fbank",&local_3e9);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffd650,
                   (ostringstream *)
                   CONCAT17(in_stack_ffffffffffffd64f,
                            CONCAT16(in_stack_ffffffffffffd64e,
                                     CONCAT15(in_stack_ffffffffffffd64d,
                                              CONCAT14(in_stack_ffffffffffffd64c,
                                                       in_stack_ffffffffffffd648)))));
        std::__cxx11::string::~string(local_3e8);
        std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_3c8);
        return local_4;
      }
      break;
    case 0x6e:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_70,pcVar1,&local_71);
      bVar2 = sptk::ConvertStringToInteger
                        (in_stack_ffffffffffffd468,(int *)in_stack_ffffffffffffd460);
      local_28e2 = !bVar2 || local_14 < 1;
      std::__cxx11::string::~string(local_70);
      std::allocator<char>::~allocator((allocator<char> *)&local_71);
      if (local_28e2) {
        std::__cxx11::ostringstream::ostringstream(local_200);
        std::operator<<((ostream *)local_200,
                        "The argument for the -n option must be a positive integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_220,"fbank",&local_221);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffd650,
                   (ostringstream *)
                   CONCAT17(in_stack_ffffffffffffd64f,
                            CONCAT16(in_stack_ffffffffffffd64e,
                                     CONCAT15(in_stack_ffffffffffffd64d,
                                              CONCAT14(in_stack_ffffffffffffd64c,
                                                       in_stack_ffffffffffffd648)))));
        std::__cxx11::string::~string(local_220);
        std::allocator<char>::~allocator((allocator<char> *)&local_221);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_200);
        return local_4;
      }
      break;
    case 0x6f:
      local_b18 = 0;
      local_b1c = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b40,pcVar1,&local_b41);
      bVar2 = sptk::ConvertStringToInteger
                        (in_stack_ffffffffffffd468,(int *)in_stack_ffffffffffffd460);
      local_29fa = 1;
      if (bVar2) {
        bVar2 = sptk::IsInRange(local_b20,0,1);
        local_29fa = bVar2 ^ 0xff;
      }
      std::__cxx11::string::~string(local_b40);
      std::allocator<char>::~allocator((allocator<char> *)&local_b41);
      if ((local_29fa & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_cc0);
        poVar4 = std::operator<<((ostream *)local_cc0,
                                 "The argument for the -o option must be an integer ");
        poVar4 = std::operator<<(poVar4,"in the range of ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,0);
        poVar4 = std::operator<<(poVar4," to ");
        std::ostream::operator<<(poVar4,1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_ce0,"fbank",&local_ce1);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffd650,
                   (ostringstream *)
                   CONCAT17(in_stack_ffffffffffffd64f,
                            CONCAT16(in_stack_ffffffffffffd64e,
                                     CONCAT15(in_stack_ffffffffffffd64d,
                                              CONCAT14(in_stack_ffffffffffffd64c,
                                                       in_stack_ffffffffffffd648)))));
        std::__cxx11::string::~string(local_ce0);
        std::allocator<char>::~allocator((allocator<char> *)&local_ce1);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_cc0);
        return local_4;
      }
      local_3c = local_b20;
      break;
    case 0x71:
      local_948 = 0;
      local_94c = 4;
      in_stack_ffffffffffffd650 = (string *)ya_optarg;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_970,(char *)in_stack_ffffffffffffd650,&local_971);
      in_stack_ffffffffffffd64f =
           sptk::ConvertStringToInteger(in_stack_ffffffffffffd468,(int *)in_stack_ffffffffffffd460);
      in_stack_ffffffffffffd64c = 1;
      if ((bool)in_stack_ffffffffffffd64f) {
        in_stack_ffffffffffffd64d = sptk::IsInRange(local_950,0,4);
        in_stack_ffffffffffffd64c = in_stack_ffffffffffffd64d ^ 0xff;
      }
      in_stack_ffffffffffffd64e = in_stack_ffffffffffffd64c;
      std::__cxx11::string::~string(local_970);
      std::allocator<char>::~allocator((allocator<char> *)&local_971);
      if ((in_stack_ffffffffffffd64c & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_af0);
        poVar4 = std::operator<<((ostream *)local_af0,
                                 "The argument for the -q option must be an integer ");
        poVar4 = std::operator<<(poVar4,"in the range of ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,0);
        poVar4 = std::operator<<(poVar4," to ");
        std::ostream::operator<<(poVar4,4);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_b10,"fbank",&local_b11);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffd650,
                   (ostringstream *)
                   CONCAT17(in_stack_ffffffffffffd64f,
                            CONCAT16(in_stack_ffffffffffffd64e,
                                     CONCAT15(in_stack_ffffffffffffd64d,
                                              CONCAT14(in_stack_ffffffffffffd64c,
                                                       in_stack_ffffffffffffd648)))));
        std::__cxx11::string::~string(local_b10);
        std::allocator<char>::~allocator((allocator<char> *)&local_b11);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_af0);
        return local_4;
      }
      local_38 = local_950;
      break;
    case 0x73:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_410,pcVar1,&local_411);
      bVar2 = sptk::ConvertStringToDouble
                        (in_stack_ffffffffffffd468,(double *)in_stack_ffffffffffffd460);
      local_2932 = !bVar2 || local_20 <= 0.0;
      std::__cxx11::string::~string(local_410);
      std::allocator<char>::~allocator((allocator<char> *)&local_411);
      if (local_2932) {
        std::__cxx11::ostringstream::ostringstream(local_590);
        std::operator<<((ostream *)local_590,
                        "The argument for the -s option must be a positive number");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_5b0,"fbank",&local_5b1);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffd650,
                   (ostringstream *)
                   CONCAT17(in_stack_ffffffffffffd64f,
                            CONCAT16(in_stack_ffffffffffffd64e,
                                     CONCAT15(in_stack_ffffffffffffd64d,
                                              CONCAT14(in_stack_ffffffffffffd64c,
                                                       in_stack_ffffffffffffd648)))));
        std::__cxx11::string::~string(local_5b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_5b1);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_590);
        return local_4;
      }
    }
  }
  local_eb8 = local_20 * 1000.0;
  if ((local_31 & 1) == 0) {
    local_30 = local_eb8 * 0.5;
  }
  else if (local_eb8 * 0.5 < local_30) {
    std::__cxx11::ostringstream::ostringstream(local_1030);
    std::operator<<((ostream *)local_1030,
                    "Highest frequency must be less than or equal to Nyquist frequency");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1050,"fbank",&local_1051);
    sptk::PrintErrorMessage
              (in_stack_ffffffffffffd650,
               (ostringstream *)
               CONCAT17(in_stack_ffffffffffffd64f,
                        CONCAT16(in_stack_ffffffffffffd64e,
                                 CONCAT15(in_stack_ffffffffffffd64d,
                                          CONCAT14(in_stack_ffffffffffffd64c,
                                                   in_stack_ffffffffffffd648)))));
    std::__cxx11::string::~string(local_1050);
    std::allocator<char>::~allocator((allocator<char> *)&local_1051);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1030);
    return local_4;
  }
  if (local_30 <= local_28) {
    std::__cxx11::ostringstream::ostringstream(local_11d0);
    std::operator<<((ostream *)local_11d0,"Lowest frequency must be less than highest one");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_11f0,"fbank",&local_11f1);
    sptk::PrintErrorMessage
              (in_stack_ffffffffffffd650,
               (ostringstream *)
               CONCAT17(in_stack_ffffffffffffd64f,
                        CONCAT16(in_stack_ffffffffffffd64e,
                                 CONCAT15(in_stack_ffffffffffffd64d,
                                          CONCAT14(in_stack_ffffffffffffd64c,
                                                   in_stack_ffffffffffffd648)))));
    std::__cxx11::string::~string(local_11f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_11f1);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_11d0);
    return local_4;
  }
  local_11f8 = local_8 - ya_optind;
  if (1 < local_11f8) {
    std::__cxx11::ostringstream::ostringstream(local_1370);
    std::operator<<((ostream *)local_1370,"Too many input files");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1390,"fbank",&local_1391);
    sptk::PrintErrorMessage
              (in_stack_ffffffffffffd650,
               (ostringstream *)
               CONCAT17(in_stack_ffffffffffffd64f,
                        CONCAT16(in_stack_ffffffffffffd64e,
                                 CONCAT15(in_stack_ffffffffffffd64d,
                                          CONCAT14(in_stack_ffffffffffffd64c,
                                                   in_stack_ffffffffffffd648)))));
    std::__cxx11::string::~string(local_1390);
    std::allocator<char>::~allocator((allocator<char> *)&local_1391);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1370);
    return local_4;
  }
  if (local_11f8 == 0) {
    local_2a90 = (char *)0x0;
  }
  else {
    local_2a90 = *(char **)(local_10 + (long)ya_optind * 8);
  }
  local_13a0 = local_2a90;
  bVar2 = sptk::SetBinaryMode();
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_1518);
    std::operator<<((ostream *)local_1518,"Cannot set translation mode");
    paVar5 = &local_1539;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1538,"fbank",paVar5);
    sptk::PrintErrorMessage
              (in_stack_ffffffffffffd650,
               (ostringstream *)
               CONCAT17(in_stack_ffffffffffffd64f,
                        CONCAT16(in_stack_ffffffffffffd64e,
                                 CONCAT15(in_stack_ffffffffffffd64d,
                                          CONCAT14(in_stack_ffffffffffffd64c,
                                                   in_stack_ffffffffffffd648)))));
    std::__cxx11::string::~string(local_1538);
    std::allocator<char>::~allocator((allocator<char> *)&local_1539);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1518);
    return local_4;
  }
  std::ifstream::ifstream(local_1748);
  if (local_13a0 != (char *)0x0) {
    in_stack_ffffffffffffd550 = local_13a0;
    in_stack_ffffffffffffd55c = std::operator|(_S_in,_S_bin);
    std::ifstream::open(local_1748,(_Ios_Openmode)in_stack_ffffffffffffd550);
    in_stack_ffffffffffffd54f = std::ios::fail();
    if ((in_stack_ffffffffffffd54f & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_18c0);
      poVar4 = std::operator<<((ostream *)local_18c0,"Cannot open file ");
      std::operator<<(poVar4,local_13a0);
      paVar5 = &local_18e1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_18e0,"fbank",paVar5);
      sptk::PrintErrorMessage
                (in_stack_ffffffffffffd650,
                 (ostringstream *)
                 CONCAT17(in_stack_ffffffffffffd64f,
                          CONCAT16(in_stack_ffffffffffffd64e,
                                   CONCAT15(in_stack_ffffffffffffd64d,
                                            CONCAT14(in_stack_ffffffffffffd64c,
                                                     in_stack_ffffffffffffd648)))));
      std::__cxx11::string::~string(local_18e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_18e1);
      local_4 = 1;
      local_18e8 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_18c0);
      goto LAB_00107268;
    }
  }
  use_power = std::ifstream::is_open();
  if ((use_power & 1) == 0) {
    local_2ad8 = (char *)&std::cin;
  }
  else {
    local_2ad8 = local_1748;
  }
  local_18f0 = local_2ad8;
  sptk::SpectrumToSpectrum::SpectrumToSpectrum
            ((SpectrumToSpectrum *)CONCAT17(in_stack_ffffffffffffd527,in_stack_ffffffffffffd520),
             (int)((ulong)in_stack_ffffffffffffd518 >> 0x20),
             (InputOutputFormats)in_stack_ffffffffffffd518,in_stack_ffffffffffffd514,
             (double)in_stack_ffffffffffffd508,
             (double)CONCAT17(in_stack_ffffffffffffd507,in_stack_ffffffffffffd500));
  if ((local_38 == 4) || (bVar2 = sptk::SpectrumToSpectrum::IsValid(&local_1938), bVar2)) {
    sptk::WaveformToSpectrum::WaveformToSpectrum
              (in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4ac,in_stack_ffffffffffffd4a8,
               (InputOutputFormats)((ulong)in_stack_ffffffffffffd4a0 >> 0x20),
               (double)in_stack_ffffffffffffd498,
               (double)CONCAT17(in_stack_ffffffffffffd497,in_stack_ffffffffffffd490));
    sptk::WaveformToSpectrum::Buffer::Buffer((Buffer *)0x106593);
    if ((local_38 != 4) ||
       (bVar2 = sptk::WaveformToSpectrum::IsValid((WaveformToSpectrum *)0x1065b4), bVar2)) {
      sptk::MelFilterBankAnalysis::MelFilterBankAnalysis
                (in_stack_ffffffffffffd560,in_stack_ffffffffffffd55c,in_stack_ffffffffffffd558,
                 (double)in_stack_ffffffffffffd550,
                 (double)CONCAT17(in_stack_ffffffffffffd54f,in_stack_ffffffffffffd548),
                 in_stack_ffffffffffffd540,in_stack_ffffffffffffd538,(bool)use_power);
      uVar3 = sptk::MelFilterBankAnalysis::IsValid(&local_1e98);
      if ((bool)uVar3) {
        iVar6 = local_18;
        if (local_38 != 4) {
          iVar6 = local_18 / 2 + 1;
        }
        local_203c = local_14;
        local_2038 = iVar6;
        std::allocator<double>::allocator((allocator<double> *)0x106935);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT17(in_stack_ffffffffffffd487,in_stack_ffffffffffffd480),
                   in_stack_ffffffffffffd478,
                   (allocator_type *)CONCAT44(in_stack_ffffffffffffd474,in_stack_ffffffffffffd470));
        std::allocator<double>::~allocator((allocator<double> *)0x106961);
        std::allocator<double>::allocator((allocator<double> *)0x10698f);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT17(in_stack_ffffffffffffd487,in_stack_ffffffffffffd480),
                   in_stack_ffffffffffffd478,
                   (allocator_type *)CONCAT44(in_stack_ffffffffffffd474,in_stack_ffffffffffffd470));
        std::allocator<double>::~allocator((allocator<double> *)0x1069b8);
        actual_read_size = (int *)(long)local_203c;
        std::allocator<double>::allocator((allocator<double> *)0x1069d7);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT17(in_stack_ffffffffffffd487,in_stack_ffffffffffffd480),
                   in_stack_ffffffffffffd478,
                   (allocator_type *)CONCAT44(in_stack_ffffffffffffd474,in_stack_ffffffffffffd470));
        std::allocator<double>::~allocator((allocator<double> *)0x1069fd);
        do {
          do {
            buffer = (Buffer *)0x0;
            bVar2 = sptk::ReadStream<double>
                              (SUB81((ulong)in_stack_ffffffffffffd4b0 >> 0x30,0),
                               (int)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4ac,
                               in_stack_ffffffffffffd4a8,in_stack_ffffffffffffd4a0,
                               (istream *)in_stack_ffffffffffffd498,actual_read_size);
            if (!bVar2) {
              local_4 = 0;
              local_18e8 = 1;
              goto LAB_001071a2;
            }
            if (local_38 == 4) {
              bVar2 = sptk::WaveformToSpectrum::Run
                                ((WaveformToSpectrum *)
                                 CONCAT44(in_stack_ffffffffffffd474,in_stack_ffffffffffffd470),
                                 (vector<double,_std::allocator<double>_> *)
                                 in_stack_ffffffffffffd468,
                                 (vector<double,_std::allocator<double>_> *)
                                 in_stack_ffffffffffffd460,buffer);
              in_stack_ffffffffffffd4ac = CONCAT13(bVar2,(int3)in_stack_ffffffffffffd4ac);
              if (!bVar2) {
                std::__cxx11::ostringstream::ostringstream(local_23c0);
                std::operator<<((ostream *)local_23c0,"Failed to transform waveform to spectrum");
                paVar5 = &local_23e1;
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_23e0,"fbank",paVar5);
                sptk::PrintErrorMessage
                          (in_stack_ffffffffffffd650,
                           (ostringstream *)
                           CONCAT17(in_stack_ffffffffffffd64f,
                                    CONCAT16(in_stack_ffffffffffffd64e,
                                             CONCAT15(in_stack_ffffffffffffd64d,
                                                      CONCAT14(in_stack_ffffffffffffd64c,
                                                               in_stack_ffffffffffffd648)))));
                std::__cxx11::string::~string(local_23e0);
                std::allocator<char>::~allocator((allocator<char> *)&local_23e1);
                local_4 = 1;
                local_18e8 = 1;
                std::__cxx11::ostringstream::~ostringstream(local_23c0);
                goto LAB_001071a2;
              }
            }
            else {
              bVar2 = sptk::SpectrumToSpectrum::Run
                                ((SpectrumToSpectrum *)
                                 CONCAT44(in_stack_ffffffffffffd4ac,in_stack_ffffffffffffd4a8),
                                 in_stack_ffffffffffffd4a0,
                                 (vector<double,_std::allocator<double>_> *)
                                 in_stack_ffffffffffffd498);
              if (!bVar2) {
                std::__cxx11::ostringstream::ostringstream(local_2220);
                std::operator<<((ostream *)local_2220,"Failed to convert spectrum");
                paVar5 = &local_2241;
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_2240,"fbank",paVar5);
                sptk::PrintErrorMessage
                          (in_stack_ffffffffffffd650,
                           (ostringstream *)
                           CONCAT17(in_stack_ffffffffffffd64f,
                                    CONCAT16(in_stack_ffffffffffffd64e,
                                             CONCAT15(in_stack_ffffffffffffd64d,
                                                      CONCAT14(in_stack_ffffffffffffd64c,
                                                               in_stack_ffffffffffffd648)))));
                std::__cxx11::string::~string(local_2240);
                std::allocator<char>::~allocator((allocator<char> *)&local_2241);
                local_4 = 1;
                local_18e8 = 1;
                std::__cxx11::ostringstream::~ostringstream(local_2220);
                goto LAB_001071a2;
              }
            }
            if (local_3c == 1) {
              in_stack_ffffffffffffd498 = local_20a8;
            }
            else {
              in_stack_ffffffffffffd498 = (ostream *)0x0;
            }
            bVar2 = sptk::MelFilterBankAnalysis::Run
                              (in_stack_ffffffffffffd508,
                               (vector<double,_std::allocator<double>_> *)
                               CONCAT17(uVar3,in_stack_ffffffffffffd500),in_stack_ffffffffffffd4f8,
                               (double *)CONCAT44(iVar6,in_stack_ffffffffffffd4f0));
            if (!bVar2) {
              std::__cxx11::ostringstream::ostringstream(local_2560);
              std::operator<<((ostream *)local_2560,"Failed to run mel-filter bank analysis");
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_2580,"fbank",&local_2581);
              sptk::PrintErrorMessage
                        (in_stack_ffffffffffffd650,
                         (ostringstream *)
                         CONCAT17(in_stack_ffffffffffffd64f,
                                  CONCAT16(in_stack_ffffffffffffd64e,
                                           CONCAT15(in_stack_ffffffffffffd64d,
                                                    CONCAT14(in_stack_ffffffffffffd64c,
                                                             in_stack_ffffffffffffd648)))));
              std::__cxx11::string::~string(local_2580);
              std::allocator<char>::~allocator((allocator<char> *)&local_2581);
              local_4 = 1;
              local_18e8 = 1;
              std::__cxx11::ostringstream::~ostringstream(local_2560);
              goto LAB_001071a2;
            }
            bVar2 = sptk::WriteStream<double>
                              ((int)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4ac,
                               in_stack_ffffffffffffd4a0,in_stack_ffffffffffffd498,
                               (int *)CONCAT17(bVar2,in_stack_ffffffffffffd490));
            if (!bVar2) {
              std::__cxx11::ostringstream::ostringstream(local_2700);
              std::operator<<((ostream *)local_2700,"Failed to write filter-bank output");
              paVar5 = &local_2721;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_2720,"fbank",paVar5);
              sptk::PrintErrorMessage
                        (in_stack_ffffffffffffd650,
                         (ostringstream *)
                         CONCAT17(in_stack_ffffffffffffd64f,
                                  CONCAT16(in_stack_ffffffffffffd64e,
                                           CONCAT15(in_stack_ffffffffffffd64d,
                                                    CONCAT14(in_stack_ffffffffffffd64c,
                                                             in_stack_ffffffffffffd648)))));
              std::__cxx11::string::~string(local_2720);
              std::allocator<char>::~allocator((allocator<char> *)&local_2721);
              local_4 = 1;
              local_18e8 = 1;
              std::__cxx11::ostringstream::~ostringstream(local_2700);
              goto LAB_001071a2;
            }
          } while (local_3c != 1);
          bVar2 = sptk::WriteStream<double>((double)buffer,(ostream *)0x10705d);
          in_stack_ffffffffffffd474 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffd474);
        } while (bVar2);
        std::__cxx11::ostringstream::ostringstream(local_28a0);
        std::operator<<((ostream *)local_28a0,"Failed to write energy");
        paVar5 = &local_28c1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_28c0,"fbank",paVar5);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffd650,
                   (ostringstream *)
                   CONCAT17(in_stack_ffffffffffffd64f,
                            CONCAT16(in_stack_ffffffffffffd64e,
                                     CONCAT15(in_stack_ffffffffffffd64d,
                                              CONCAT14(in_stack_ffffffffffffd64c,
                                                       in_stack_ffffffffffffd648)))));
        std::__cxx11::string::~string(local_28c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_28c1);
        local_4 = 1;
        local_18e8 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_28a0);
LAB_001071a2:
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT44(in_stack_ffffffffffffd474,in_stack_ffffffffffffd470));
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT44(in_stack_ffffffffffffd474,in_stack_ffffffffffffd470));
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT44(in_stack_ffffffffffffd474,in_stack_ffffffffffffd470));
      }
      else {
        std::__cxx11::ostringstream::ostringstream(local_2010);
        std::operator<<((ostream *)local_2010,"Failed to set condition for filter-bank analysis");
        paVar5 = &local_2031;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2030,"fbank",paVar5);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffd650,
                   (ostringstream *)
                   CONCAT17(in_stack_ffffffffffffd64f,
                            CONCAT16(in_stack_ffffffffffffd64e,
                                     CONCAT15(in_stack_ffffffffffffd64d,
                                              CONCAT14(in_stack_ffffffffffffd64c,
                                                       in_stack_ffffffffffffd648)))));
        std::__cxx11::string::~string(local_2030);
        std::allocator<char>::~allocator((allocator<char> *)&local_2031);
        local_4 = 1;
        local_18e8 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_2010);
      }
      sptk::MelFilterBankAnalysis::~MelFilterBankAnalysis
                ((MelFilterBankAnalysis *)in_stack_ffffffffffffd460);
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_1e00);
      std::operator<<((ostream *)local_1e00,"Failed to set condition for spectral analysis");
      paVar5 = &local_1e21;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1e20,"fbank",paVar5);
      sptk::PrintErrorMessage
                (in_stack_ffffffffffffd650,
                 (ostringstream *)
                 CONCAT17(in_stack_ffffffffffffd64f,
                          CONCAT16(in_stack_ffffffffffffd64e,
                                   CONCAT15(in_stack_ffffffffffffd64d,
                                            CONCAT14(in_stack_ffffffffffffd64c,
                                                     in_stack_ffffffffffffd648)))));
      std::__cxx11::string::~string(local_1e20);
      std::allocator<char>::~allocator((allocator<char> *)&local_1e21);
      local_4 = 1;
      local_18e8 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_1e00);
    }
    sptk::WaveformToSpectrum::Buffer::~Buffer((Buffer *)0x10721f);
    sptk::WaveformToSpectrum::~WaveformToSpectrum(in_stack_ffffffffffffd460);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1ab0);
    std::operator<<((ostream *)local_1ab0,"Failed to set condition for input formatting");
    paVar5 = &local_1ad1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1ad0,"fbank",paVar5);
    sptk::PrintErrorMessage
              (in_stack_ffffffffffffd650,
               (ostringstream *)
               CONCAT17(in_stack_ffffffffffffd64f,
                        CONCAT16(in_stack_ffffffffffffd64e,
                                 CONCAT15(in_stack_ffffffffffffd64d,
                                          CONCAT14(in_stack_ffffffffffffd64c,
                                                   in_stack_ffffffffffffd648)))));
    std::__cxx11::string::~string(local_1ad0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1ad1);
    local_4 = 1;
    local_18e8 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1ab0);
  }
  sptk::SpectrumToSpectrum::~SpectrumToSpectrum
            ((SpectrumToSpectrum *)CONCAT44(in_stack_ffffffffffffd474,in_stack_ffffffffffffd470));
LAB_00107268:
  std::ifstream::~ifstream(local_1748);
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_channel(kDefaultNumChannel);
  int fft_length(kDefaultFftLength);
  double sampling_rate(kDefaultSamplingRate);
  double lowest_frequency(kDefaultLowestFrequency);
  double highest_frequency(0.0);
  bool is_highest_frequency_specified(false);
  InputFormats input_format(kDefaultInputFormat);
  OutputFormats output_format(kDefaultOutputFormat);
  double floor(kDefaultFloor);

  for (;;) {
    const int option_char(
        getopt_long(argc, argv, "n:l:s:L:H:q:o:e:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'n': {
        if (!sptk::ConvertStringToInteger(optarg, &num_channel) ||
            num_channel <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -n option must be a positive integer";
          sptk::PrintErrorMessage("fbank", error_message);
          return 1;
        }
        break;
      }
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &fft_length)) {
          std::ostringstream error_message;
          error_message << "The argument for the -l option must be an integer";
          sptk::PrintErrorMessage("fbank", error_message);
          return 1;
        }
        break;
      }
      case 's': {
        if (!sptk::ConvertStringToDouble(optarg, &sampling_rate) ||
            sampling_rate <= 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -s option must be a positive number";
          sptk::PrintErrorMessage("fbank", error_message);
          return 1;
        }
        break;
      }
      case 'L': {
        if (!sptk::ConvertStringToDouble(optarg, &lowest_frequency) ||
            lowest_frequency < 0.0) {
          std::ostringstream error_message;
          error_message << "The argument for the -L option must be a "
                        << "non-negative number";
          sptk::PrintErrorMessage("fbank", error_message);
          return 1;
        }
        break;
      }
      case 'H': {
        if (!sptk::ConvertStringToDouble(optarg, &highest_frequency) ||
            highest_frequency <= 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -H option must be a positive number";
          sptk::PrintErrorMessage("fbank", error_message);
          return 1;
        }
        is_highest_frequency_specified = true;
        break;
      }
      case 'q': {
        const int min(0);
        const int max(static_cast<int>(kNumInputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -q option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("fbank", error_message);
          return 1;
        }
        input_format = static_cast<InputFormats>(tmp);
        break;
      }
      case 'o': {
        const int min(0);
        const int max(static_cast<int>(kNumOutputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -o option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("fbank", error_message);
          return 1;
        }
        output_format = static_cast<OutputFormats>(tmp);
        break;
      }
      case 'e': {
        if (!sptk::ConvertStringToDouble(optarg, &floor) || floor <= 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -e option must be a positive number";
          sptk::PrintErrorMessage("fbank", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const double sampling_rate_in_hz(1000.0 * sampling_rate);
  if (!is_highest_frequency_specified) {
    highest_frequency = 0.5 * sampling_rate_in_hz;
  } else if (0.5 * sampling_rate_in_hz < highest_frequency) {
    std::ostringstream error_message;
    error_message
        << "Highest frequency must be less than or equal to Nyquist frequency";
    sptk::PrintErrorMessage("fbank", error_message);
    return 1;
  }

  if (highest_frequency <= lowest_frequency) {
    std::ostringstream error_message;
    error_message << "Lowest frequency must be less than highest one";
    sptk::PrintErrorMessage("fbank", error_message);
    return 1;
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("fbank", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("fbank", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("fbank", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::SpectrumToSpectrum spectrum_to_spectrum(
      fft_length,
      static_cast<sptk::SpectrumToSpectrum::InputOutputFormats>(input_format),
      sptk::SpectrumToSpectrum::InputOutputFormats::kPowerSpectrum);
  if (kWaveform != input_format && !spectrum_to_spectrum.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to set condition for input formatting";
    sptk::PrintErrorMessage("fbank", error_message);
    return 1;
  }

  sptk::WaveformToSpectrum waveform_to_spectrum(
      fft_length, fft_length,
      sptk::SpectrumToSpectrum::InputOutputFormats::kPowerSpectrum);
  sptk::WaveformToSpectrum::Buffer buffer_for_spectral_analysis;
  if (kWaveform == input_format && !waveform_to_spectrum.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to set condition for spectral analysis";
    sptk::PrintErrorMessage("fbank", error_message);
    return 1;
  }

  sptk::MelFilterBankAnalysis analysis(fft_length, num_channel,
                                       sampling_rate_in_hz, lowest_frequency,
                                       highest_frequency, floor, false);
  if (!analysis.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to set condition for filter-bank analysis";
    sptk::PrintErrorMessage("fbank", error_message);
    return 1;
  }

  const int input_length(kWaveform == input_format ? fft_length
                                                   : fft_length / 2 + 1);
  const int output_length(num_channel);
  std::vector<double> input(input_length);
  std::vector<double> processed_input(fft_length / 2 + 1);
  std::vector<double> output(output_length);
  double energy;

  while (sptk::ReadStream(false, 0, 0, input_length, &input, &input_stream,
                          NULL)) {
    if (kWaveform != input_format) {
      if (!spectrum_to_spectrum.Run(input, &processed_input)) {
        std::ostringstream error_message;
        error_message << "Failed to convert spectrum";
        sptk::PrintErrorMessage("fbank", error_message);
        return 1;
      }
    } else {
      if (!waveform_to_spectrum.Run(input, &processed_input,
                                    &buffer_for_spectral_analysis)) {
        std::ostringstream error_message;
        error_message << "Failed to transform waveform to spectrum";
        sptk::PrintErrorMessage("fbank", error_message);
        return 1;
      }
    }

    if (!analysis.Run(processed_input, &output,
                      kFbankAndEnergy == output_format ? &energy : NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to run mel-filter bank analysis";
      sptk::PrintErrorMessage("fbank", error_message);
      return 1;
    }

    if (!sptk::WriteStream(0, output_length, output, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write filter-bank output";
      sptk::PrintErrorMessage("fbank", error_message);
      return 1;
    }

    if (kFbankAndEnergy == output_format) {
      if (!sptk::WriteStream(energy, &std::cout)) {
        std::ostringstream error_message;
        error_message << "Failed to write energy";
        sptk::PrintErrorMessage("fbank", error_message);
        return 1;
      }
    }
  }

  return 0;
}